

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O2

void olsrv2_routing_freeze_routes(_Bool freeze)

{
  if ((_freeze_routes != freeze) && (_freeze_routes = freeze, !freeze)) {
    _trigger_dijkstra = 1;
    if (_rate_limit_timer._clock == 0) {
      oonf_timer_set_ext(&_rate_limit_timer,1,1);
    }
    if (((&log_global_mask)[LOG_OLSRV2_ROUTING] & 1) != 0) {
      oonf_log(1,(ulong)LOG_OLSRV2_ROUTING,"src/olsrv2/olsrv2/olsrv2_routing.c",0xf8,0,0,
               "Trigger routing update");
    }
    return;
  }
  return;
}

Assistant:

void
olsrv2_routing_freeze_routes(bool freeze) {
  if (_freeze_routes == freeze) {
    return;
  }

  _freeze_routes = freeze;
  if (!freeze) {
    /* make sure we have a current routing table */
    olsrv2_routing_trigger_update();
  }
}